

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall
absl::make_unique<S2ClosestEdgeQuery,S2ShapeIndex_const*&>(absl *this,S2ShapeIndex **args)

{
  S2ShapeIndex *index;
  S2ClosestEdgeQuery *this_00;
  Options local_38;
  
  this_00 = (S2ClosestEdgeQuery *)operator_new(0x2f8);
  index = *args;
  local_38.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.max_error_.length2_ = 0.0;
  local_38.max_results_ = 0;
  local_38.include_interiors_ = false;
  local_38.use_brute_force_ = false;
  local_38._22_2_ = 0;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::Options(&local_38);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery(this_00,index,(Options *)&local_38);
  *(S2ClosestEdgeQuery **)this = this_00;
  return (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}